

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<int_const*,int>,gnuplotio::IteratorRange<int_const*,int>,gnuplotio::ModeBinary>
               (char *stream,IteratorRange<const_int_*,_int> *arg)

{
  value_type vVar1;
  value_type in_register_00000004;
  value_type local_18;
  value_type local_14;
  
  local_14 = in_register_00000004;
  vVar1 = IteratorRange<const_int_*,_int>::deref(arg);
  _local_18 = CONCAT44(local_14,vVar1);
  std::ostream::write(stream,(long)&local_18);
  vVar1 = IteratorRange<const_int_*,_int>::deref(arg + 1);
  _local_18 = CONCAT44(vVar1,local_18);
  std::ostream::write(stream,(long)&local_14);
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const PairOfRange<T, U> &arg, PrintMode) {
    deref_and_print(stream, arg.l, PrintMode());
    if(PrintMode::is_text) stream << " ";
    deref_and_print(stream, arg.r, PrintMode());
}